

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

char * SoapySDRDevice_readSetting(SoapySDRDevice *device,char *key)

{
  char *in_RSI;
  long *in_RDI;
  exception *ex;
  allocator *s;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  char *local_18;
  long *local_10;
  char *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  s = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,local_18,s);
  (**(code **)(*local_10 + 0x338))(local_38,local_10,local_58);
  local_8 = toCString((string *)s);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return local_8;
}

Assistant:

char *SoapySDRDevice_readSetting(const SoapySDRDevice *device, const char *key)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->readSetting(key));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}